

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

Array * __thiscall jsonnet::internal::Desugarer::singleton(Desugarer *this,AST *body)

{
  initializer_list<jsonnet::internal::Array::Element> __l;
  AST *in_stack_ffffffffffffff28;
  Element *in_stack_ffffffffffffff30;
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
  *in_stack_ffffffffffffff38;
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
  *in_stack_ffffffffffffff40;
  LocationRange *in_stack_ffffffffffffff48;
  Desugarer *in_stack_ffffffffffffff50;
  undefined8 **ppuVar1;
  allocator_type *in_stack_ffffffffffffff58;
  undefined8 **ppuVar2;
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
  *in_stack_ffffffffffffff60;
  iterator in_stack_ffffffffffffff68;
  undefined1 *puVar3;
  undefined1 local_75 [13];
  undefined8 *local_68;
  undefined1 *local_60 [4];
  undefined8 *local_40;
  undefined8 local_38;
  Array *local_8;
  
  local_68 = local_60;
  Array::Element::Element(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(Fodder *)0x21a0f3);
  local_40 = local_60;
  local_38 = 1;
  puVar3 = local_75;
  ::std::allocator<jsonnet::internal::Array::Element>::allocator
            ((allocator<jsonnet::internal::Array::Element> *)0x21a11d);
  __l._M_len = (size_type)puVar3;
  __l._M_array = in_stack_ffffffffffffff68;
  ::std::
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>::
  vector(in_stack_ffffffffffffff60,__l,in_stack_ffffffffffffff58);
  local_8 = make<jsonnet::internal::Array,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                      (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                       (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                       (bool *)in_stack_ffffffffffffff30,
                       (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        *)in_stack_ffffffffffffff28);
  ::std::
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>::
  ~vector(in_stack_ffffffffffffff40);
  ::std::allocator<jsonnet::internal::Array::Element>::~allocator
            ((allocator<jsonnet::internal::Array::Element> *)0x21a197);
  ppuVar2 = (undefined8 **)local_60;
  ppuVar1 = &local_40;
  do {
    ppuVar1 = ppuVar1 + -4;
    Array::Element::~Element((Element *)0x21a1bd);
  } while (ppuVar1 != ppuVar2);
  return local_8;
}

Assistant:

Array *singleton(AST *body)
    {
        return make<Array>(
            body->location, EF, Array::Elements{Array::Element(body, EF)}, false, EF);
    }